

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O2

string * __thiscall
LatencyDumpDefaultImpl::dump_abi_cxx11_
          (string *__return_storage_ptr__,LatencyDumpDefaultImpl *this,MapWrapper *map_w,
          LatencyCollectorDumpOptions *opt)

{
  _Rb_tree_header *p_Var1;
  SortBy SVar2;
  LatencyItem *pLVar3;
  size_t sVar4;
  iterator iVar5;
  LatencyItem *this_00;
  ostream *poVar6;
  __int_type value;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  undefined1 in_R9B;
  __node_base *p_Var9;
  LatencyItem *local_270;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  local_260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  map_string;
  string actual_name;
  multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  map_uint64_t;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  sVar4 = MapWrapper::getSize(map_w);
  if (sVar4 == 0) {
    poVar6 = std::operator<<(local_1a8,"# stats: ");
    MapWrapper::getSize(map_w);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::stringbuf::str();
  }
  else {
    map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header;
    map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &map_string._M_t._M_impl.super__Rb_tree_header;
    map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    map_string._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var9 = &(map_w->map)._M_h._M_before_begin;
    local_270 = (LatencyItem *)0x9;
    map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      pLVar3 = (LatencyItem *)p_Var9[5]._M_nxt;
      if ((pLVar3->hist).count.super___atomic_base<unsigned_long>._M_i != 0) {
        std::__cxx11::string::string((string *)&local_260,(string *)pLVar3);
        getActualFunction(&actual_name,&local_260.first,false);
        std::__cxx11::string::~string((string *)&local_260);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                ::find(&map_string._M_t,&actual_name);
        if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
          this_00 = (LatencyItem *)operator_new(0x50);
          LatencyItem::LatencyItem(this_00,pLVar3);
          std::__cxx11::string::string((string *)&local_260,(string *)&actual_name);
          local_260.second = this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::_Select1st<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,LatencyItem*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::_Select1st<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
                      *)&map_string,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
        }
        else {
          Histogram::operator+=((Histogram *)(*(long *)(iVar5._M_node + 2) + 0x20),&pLVar3->hist);
        }
        if (local_270 < actual_name._M_string_length) {
          local_270 = (LatencyItem *)actual_name._M_string_length;
        }
        std::__cxx11::string::~string((string *)&actual_name);
      }
    }
    poVar6 = std::operator<<(local_1a8,"# stats: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    for (p_Var7 = map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      pLVar3 = *(LatencyItem **)(p_Var7 + 2);
      if ((pLVar3->hist).count.super___atomic_base<unsigned_long>._M_i != 0) {
        SVar2 = opt->sort_by;
        if (SVar2 == AVG_LATENCY) {
          if ((pLVar3->hist).count.super___atomic_base<unsigned_long>._M_i == 0) {
            value = 0;
          }
          else {
            value = (pLVar3->hist).sum.super___atomic_base<unsigned_long>._M_i /
                    (pLVar3->hist).count.super___atomic_base<unsigned_long>._M_i;
          }
        }
        else if (SVar2 == NUM_CALLS) {
          value = (pLVar3->hist).count.super___atomic_base<unsigned_long>._M_i;
        }
        else {
          if (SVar2 != TOTAL_TIME) goto LAB_00106886;
          value = (pLVar3->hist).sum.super___atomic_base<unsigned_long>._M_i;
        }
        addToUintMap(value,&map_uint64_t,pLVar3);
      }
LAB_00106886:
    }
    addDumpTitle(&ss,(size_t)local_270);
    if (opt->sort_by == NAME) {
      for (p_Var7 = map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var8 = map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7))
      {
        if ((*(LatencyDumpDefaultImpl **)(p_Var7 + 2))[7].super_LatencyDump._vptr_LatencyDump !=
            (_func_int **)0x0) {
          dumpItem_abi_cxx11_(&local_260.first,*(LatencyDumpDefaultImpl **)(p_Var7 + 2),local_270,0,
                              0,(bool)in_R9B);
          poVar6 = std::operator<<(local_1a8,(string *)&local_260);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&local_260);
        }
      }
    }
    else {
      for (p_Var7 = map_uint64_t._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var8 = map_string._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          (_Rb_tree_header *)p_Var7 != &map_uint64_t._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        if (p_Var7[1]._M_parent[1]._M_right != (_Base_ptr)0x0) {
          dumpItem_abi_cxx11_(&local_260.first,(LatencyDumpDefaultImpl *)p_Var7[1]._M_parent,
                              local_270,0,0,(bool)in_R9B);
          poVar6 = std::operator<<(local_1a8,(string *)&local_260);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&local_260);
        }
      }
    }
    for (; (_Rb_tree_header *)p_Var8 != p_Var1;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      pLVar3 = *(LatencyItem **)(p_Var8 + 2);
      if (pLVar3 != (LatencyItem *)0x0) {
        LatencyItem::~LatencyItem(pLVar3);
      }
      operator_delete(pLVar3);
    }
    std::__cxx11::stringbuf::str();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
    ::~_Rb_tree(&map_string._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_LatencyItem_*>,_std::_Select1st<std::pair<const_unsigned_long,_LatencyItem_*>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
    ::~_Rb_tree(&map_uint64_t._M_t);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string dump(MapWrapper* map_w,
                     const LatencyCollectorDumpOptions& opt) {
        std::stringstream ss;
        if (!map_w->getSize()) {
            ss << "# stats: " << map_w->getSize() << std::endl;
            return ss.str();
        }

        std::multimap<uint64_t,
                      LatencyItem*,
                      std::greater<uint64_t> > map_uint64_t;
        std::map<std::string, LatencyItem*> map_string;
        size_t max_name_len = 9; // reserved for "STAT NAME" 9 chars

        std::unordered_map<std::string, LatencyItem*>& map = getMap(map_w);

        // Deduplication
        for (auto& entry: map) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) {
                continue;
            }
            std::string actual_name = getActualFunction(item->getName(), false);

            auto existing = map_string.find(actual_name);
            if (existing != map_string.end()) {
                LatencyItem* item_found = existing->second;
                *item_found += *item;
            } else {
                LatencyItem* new_item = new LatencyItem(*item);
                map_string.insert( std::make_pair(actual_name, new_item) );
            }

            if (actual_name.size() > max_name_len) {
                max_name_len = actual_name.size();
            }
        }

        ss << "# stats: " << map_string.size() << std::endl;

        for (auto& entry: map_string) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) continue;

            switch (opt.sort_by) {
            case LatencyCollectorDumpOptions::NAME: {
                // Do nothing
                break;
            }

            // Otherwise: dealing with uint64_t, map_uint64_t.
            case LatencyCollectorDumpOptions::TOTAL_TIME:
                addToUintMap(item->getTotalTime(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::NUM_CALLS:
                addToUintMap(item->getNumCalls(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::AVG_LATENCY:
                addToUintMap(item->getAvgLatency(), map_uint64_t, item);
                break;
            }
        }

        addDumpTitle(ss, max_name_len);

        if (opt.sort_by == LatencyCollectorDumpOptions::NAME) {
            // Name (string)
            for (auto& entry: map_string) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        } else {
            // Otherwise (number)
            for (auto& entry: map_uint64_t) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        }

        // Free all.
        for (auto& entry: map_string) {
            delete entry.second;
        }

        return ss.str();
    }